

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O1

QString * __thiscall
QOpenGLProgramBinaryCache::cacheFileName
          (QString *__return_storage_ptr__,QOpenGLProgramBinaryCache *this,QByteArray *cacheKey)

{
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QStringBuilder<const_QString_&,_QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1.m_data = (storage_type *)(cacheKey->d).size;
  QVar1.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar1);
  local_48.b.d.size = local_58;
  local_48.b.d.ptr = pcStack_60;
  local_48.b.d.d = (Data *)local_68;
  local_68 = (QArrayData *)0x0;
  pcStack_60 = (char16_t *)0x0;
  local_58 = 0;
  local_48.a = &this->m_currentCacheDir;
  QStringBuilder<const_QString_&,_QString>::convertTo<QString>(__return_storage_ptr__,&local_48);
  if (&(local_48.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.b.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QOpenGLProgramBinaryCache::cacheFileName(const QByteArray &cacheKey) const
{
    return m_currentCacheDir + QString::fromUtf8(cacheKey);
}